

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQ<float,long>
          (internal *this,char *expected_expression,char *actual_expression,float *expected,
          long *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar2;
  String local_50;
  String local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if ((*expected != (float)*actual) || (NAN(*expected) || NAN((float)*actual))) {
    FormatForComparisonFailureMessage<float,long>((float *)&local_50,(long *)expected);
    FormatForComparisonFailureMessage<long,float>((long *)&local_40,(float *)actual);
    EqFailure(this,expected_expression,actual_expression,&local_50,&local_40,false);
    String::~String(&local_40);
    String::~String(&local_50);
    sVar1.ptr_ = extraout_RDX;
  }
  else {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}